

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O2

void __thiscall
Fad<Fad<double>>::Fad<FadUnaryMin<Fad<Fad<double>>>>
          (Fad<Fad<double>> *this,FadExpr<FadUnaryMin<Fad<Fad<double>_>_>_> *fadexpr)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  value_type local_50;
  
  FadUnaryMin<Fad<Fad<double>_>_>::val((value_type *)(this + 8),&fadexpr->fadexpr_);
  Vector<Fad<double>_>::Vector
            ((Vector<Fad<double>_> *)(this + 0x28),(((fadexpr->fadexpr_).expr_)->dx_).num_elts);
  *(undefined8 *)(this + 0x38) = 0;
  *(undefined4 *)(this + 0x40) = 0;
  *(undefined8 *)(this + 0x48) = 0;
  *(undefined8 *)(this + 0x50) = 0;
  uVar1 = (((fadexpr->fadexpr_).expr_)->dx_).num_elts;
  if (uVar1 != 0) {
    uVar4 = 0;
    uVar2 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar2 = uVar4;
    }
    for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      FadUnaryMin<Fad<Fad<double>_>_>::dx(&local_50,&fadexpr->fadexpr_,(int)uVar3);
      Fad<double>::operator=((Fad<double> *)(*(long *)(this + 0x30) + uVar4),&local_50);
      Fad<double>::~Fad(&local_50);
      uVar4 = uVar4 + 0x20;
    }
  }
  return;
}

Assistant:

inline Fad(const FadExpr<ExprT>& fadexpr) : 
    val_(fadexpr.val()), 
    dx_(fadexpr.size()), 
    defaultVal(T(0))
    {
      int sz = fadexpr.size();

      if ( sz ) {
        for(int i=0; i<sz; ++i) 
          dx_[i] = fadexpr.dx(i);
      }
    }